

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O2

fstream * __thiscall
SharedDirectory::open_writable_file
          (fstream *__return_storage_ptr__,SharedDirectory *this,string *name)

{
  iterator iVar1;
  Error *this_00;
  path local_60;
  string local_40;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->pending_files)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->pending_files)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::string::string((string *)&local_40,(string *)name);
    path_in_dir(&local_60,this,&local_40);
    boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
              (__return_storage_ptr__,&local_60,_S_out);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    return __return_storage_ptr__;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"File should be reserved first");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

boost::filesystem::fstream SharedDirectory::open_writable_file(const std::string &name) {
  if (pending_files.find(name) == pending_files.end()) {
    throw Error("File should be reserved first");
  }
  return fstream(path_in_dir(name), std::ios::out);
}